

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>
                   (String *__return_storage_ptr__,Builder *params)

{
  Builder *value;
  StringTree local_50;
  Builder *local_18;
  Builder *params_local;
  
  local_18 = params;
  params_local = (Builder *)__return_storage_ptr__;
  value = fwd<capnproto_test::capnp::test::TestUnion::Union0::Builder>(params);
  toCharSequence<capnproto_test::capnp::test::TestUnion::Union0::Builder>(&local_50,value);
  _::concat<kj::StringTree>(__return_storage_ptr__,&local_50);
  StringTree::~StringTree(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}